

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.hh
# Opt level: O0

void __thiscall Pl_Base64::~Pl_Base64(Pl_Base64 *this)

{
  Pl_Base64 *this_local;
  
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

~Pl_Base64() final = default;